

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_fa.c
# Opt level: O1

int isobusfs_srv_rx_cg_fa(isobusfs_srv_priv *priv,isobusfs_msg *msg)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  bool bVar4;
  ushort uVar5;
  wchar_t wVar6;
  uint uVar7;
  int iVar8;
  int32_t iVar9;
  isobusfs_srv_client_conflict *client;
  ulong uVar10;
  undefined8 *buf;
  isobusfs_srv_handles *piVar11;
  dirent *pdVar12;
  size_t __n;
  tm *ptVar13;
  DIR *pDVar14;
  isobusfs_srv_client *piVar15;
  undefined8 uVar16;
  __off_t _Var17;
  int *piVar18;
  long lVar19;
  size_t buf_size;
  undefined1 uVar20;
  char *pcVar21;
  int iVar22;
  undefined1 *puVar23;
  uint8_t *puVar24;
  uint uVar25;
  DIR *dir;
  char linux_path [4096];
  long local_10f0;
  undefined8 local_10e0;
  undefined1 *local_10d8;
  undefined8 local_10d0;
  stat local_10c8;
  stat local_1038 [28];
  
  switch(msg->buf[0] & 0xf) {
  case 0:
    uVar3 = *(ushort *)(msg->buf + 4);
    client = (isobusfs_srv_client_conflict *)isobusfs_srv_get_client_by_msg(priv,msg);
    if (client == (isobusfs_srv_client_conflict *)0x0) {
      uVar20 = 0;
      isobusfs_log(2,"client not found");
      wVar6 = L',';
    }
    else {
      uVar20 = 0;
      wVar6 = L'\x02';
      if ((uVar3 < 0xfffb) && ((ulong)uVar3 <= msg->len - 6U)) {
        pcVar21 = (char *)malloc(0x1000);
        if (pcVar21 == (char *)0x0) {
          isobusfs_log(2,"failed to allocate memory");
          return -0xc;
        }
        if (client->current_dir[0] == '\0') {
          isobusfs_srv_set_default_current_dir((isobusfs_srv_priv_conflict *)priv,client);
        }
        wVar6 = isobusfs_convert_relative_to_absolute
                          ((isobusfs_srv_priv_conflict *)priv,client->current_dir,
                           (char *)(msg->buf + 6),(ulong)*(ushort *)(msg->buf + 4),pcVar21,0x1000);
        if (wVar6 < L'\0') {
          wVar6 = L'\x04';
          goto switchD_001057ac_caseD_3;
        }
        isobusfs_log(4,"< rx: Open File Request. from client 0x%2x: %.*s. Current directory: %s",
                     client->addr,*(undefined2 *)(msg->buf + 4),msg->buf + 6,client->current_dir);
        bVar1 = msg->buf[2];
        if ((~bVar1 & 3) == 0) {
          wVar6 = isobusfs_path_to_linux_path
                            ((isobusfs_srv_priv_conflict *)priv,pcVar21,0x1000,(char *)local_1038,
                             0x1000);
          if (wVar6 < L'\0') goto switchD_001057ac_caseD_3;
          lVar19 = 0xf3a48;
          do {
            pcVar21 = *(char **)((priv->st).reserved + lVar19 + -0x2f);
            if (pcVar21 != (char *)0x0) {
              iVar8 = strcmp(pcVar21,(char *)local_1038);
              if (iVar8 == 0) {
                isobusfs_log(1,"%s: Path %s is already opened\n","isobusfs_srv_fa_open_directory",
                             local_1038);
                wVar6 = L',';
                goto switchD_001057ac_caseD_3;
              }
            }
            lVar19 = lVar19 + 0x790;
          } while (lVar19 != 0x16c2b8);
          pDVar14 = opendir((char *)local_1038);
          if (pDVar14 == (DIR *)0x0) {
            piVar18 = __errno_location();
            iVar8 = *piVar18;
            pcVar21 = strerror(iVar8);
            uVar20 = 0;
            wVar6 = L'\x01';
            isobusfs_log(1,"%s: Error opening directory %s. Error %d (%s)\n",
                         "isobusfs_srv_fa_open_directory",local_1038,iVar8,pcVar21);
            iVar8 = *piVar18;
            if (iVar8 == 0xd) goto LAB_001058a0;
            if (iVar8 != 0xc) {
              if (iVar8 == 2) goto LAB_00105c0d;
              goto LAB_00105c1c;
            }
LAB_00105c06:
            wVar6 = L'+';
          }
          else {
            iVar8 = dirfd(pDVar14);
            if (iVar8 < 0) {
              piVar18 = __errno_location();
              iVar8 = *piVar18;
              pcVar21 = strerror(iVar8);
              uVar20 = 0;
              isobusfs_log(1,"%s: Error getting file descriptor for directory %s. Error %d (%s)\n",
                           "isobusfs_srv_fa_open_directory",local_1038,iVar8,pcVar21);
              closedir(pDVar14);
              wVar6 = L',';
              goto LAB_001058a0;
            }
            iVar22 = fstat(iVar8,&local_10c8);
            if ((iVar22 < 0) || ((local_10c8.st_mode & 0xf000) != 0x4000)) {
              uVar20 = 0;
              isobusfs_log(1,"%s: Path %s is not a directory\n","isobusfs_srv_fa_open_directory",
                           local_1038);
              closedir(pDVar14);
              wVar6 = L'\x02';
              goto LAB_001058a0;
            }
            wVar6 = isobusfs_srv_request_file
                              (priv,(isobusfs_srv_client *)client,(char *)local_1038,iVar8,
                               (DIR *)pDVar14);
            if (L'\xffffffff' < wVar6) goto LAB_00105a9f;
            closedir(pDVar14);
          }
        }
        else {
          wVar6 = isobusfs_path_to_linux_path
                            ((isobusfs_srv_priv_conflict *)priv,pcVar21,0x1000,(char *)local_1038,
                             0x1000);
          uVar7 = 0;
          if (wVar6 < L'\0') {
switchD_001057ac_caseD_3:
            uVar20 = 0;
            goto LAB_001058a0;
          }
          isobusfs_log(4,"convert ISOBUS FS path to linux path: %.*s -> %s",0x1000,pcVar21);
          wVar6 = L'\x02';
          switch(bVar1 & 3) {
          case 1:
            uVar7 = 1;
            break;
          case 2:
            uVar7 = (uint)((bVar1 & 8) == 0) << 9 | 2;
            break;
          case 3:
            goto switchD_001057ac_caseD_3;
          }
          lVar19 = 0xf3a48;
          do {
            pcVar21 = *(char **)((priv->st).reserved + lVar19 + -0x2f);
            if (pcVar21 != (char *)0x0) {
              iVar8 = strcmp(pcVar21,(char *)local_1038);
              if (iVar8 == 0) {
                puVar24 = (priv->st).reserved + lVar19 + -0x2f;
                goto LAB_00105a57;
              }
            }
            lVar19 = lVar19 + 0x790;
          } while (lVar19 != 0x16c2b8);
          puVar24 = (uint8_t *)0x0;
LAB_00105a57:
          if (puVar24 == (uint8_t *)0x0) {
            iVar8 = open((char *)local_1038,(bVar1 & 8) << 7 | uVar7);
            if (iVar8 < 0) {
              piVar18 = __errno_location();
              iVar8 = *piVar18;
              if (iVar8 < 0x16) {
                if (iVar8 == 2) {
LAB_00105c0d:
                  wVar6 = L'\x04';
                }
                else {
                  if (iVar8 == 0xc) goto LAB_00105c06;
                  if (iVar8 != 0xd) goto LAB_00105c1c;
                  wVar6 = L'\x01';
                }
              }
              else if (iVar8 - 0x17U < 2) {
                wVar6 = L'\x03';
              }
              else if (iVar8 != 0x16) goto LAB_00105c1c;
            }
            else {
              iVar22 = fstat(iVar8,&local_10c8);
              if (-1 < iVar22) {
                if ((local_10c8.st_mode & 0xf000) == 0x8000) goto LAB_00105a80;
                goto LAB_00105aea;
              }
              close(iVar8);
LAB_00105c1c:
              wVar6 = L',';
            }
          }
          else {
            isobusfs_log(2,"Handle: %s is already opened by client: %x\n",local_1038,client->addr);
            iVar8 = *(int *)(puVar24 + 0xc);
LAB_00105a80:
            wVar6 = isobusfs_srv_request_file
                              (priv,(isobusfs_srv_client *)client,(char *)local_1038,iVar8,
                               (DIR *)0x0);
            if (L'\xffffffff' < wVar6) {
LAB_00105a9f:
              uVar20 = (undefined1)wVar6;
              wVar6 = L'\0';
              goto LAB_001058a0;
            }
LAB_00105aea:
            close(iVar8);
          }
        }
        uVar20 = 0;
      }
    }
LAB_001058a0:
    local_10e0._0_4_ = CONCAT13(uVar20,CONCAT12((char)wVar6,CONCAT11(msg->buf[1],0x20)));
    local_10e0 = CONCAT17(0xff,CONCAT25(0xffff,(undefined5)local_10e0));
    iVar8 = isobusfs_srv_sendto(priv,msg,&local_10e0,8);
    if (-1 < iVar8) {
      uVar16 = isobusfs_error_to_str(wVar6 & 0xffU);
      isobusfs_log(4,"> tx: Open File Response. Error code: %d (%s).",wVar6 & 0xffU,uVar16);
      return iVar8;
    }
    break;
  case 1:
    local_1038[0].st_dev._0_1_ = 0;
    local_1038[0].st_dev._1_1_ = 0;
    local_1038[0].st_dev._2_1_ = 0;
    local_1038[0].st_dev._3_4_ = 0;
    local_1038[0].st_dev._7_1_ = 0;
    isobusfs_log(4,"< rx: Seek File Request. Handle: %x, offset: %d, position mode: %d",msg->buf[2],
                 *(undefined4 *)(msg->buf + 4),msg->buf[3]);
    piVar15 = isobusfs_srv_get_client_by_msg(priv,msg);
    if (piVar15 == (isobusfs_srv_client *)0x0) {
      isobusfs_log(2,"client not found");
      uVar20 = 0x2c;
    }
    else {
      uVar10 = (ulong)msg->buf[2];
      if (uVar10 == 0xff) {
        isobusfs_log(2,"failed to find handle: %x");
        uVar20 = 5;
      }
      else {
        iVar8 = *(int *)(msg->buf + 4);
        if (priv->handles[uVar10].dir == (DIR *)0x0) {
          uVar2 = msg->buf[3];
          if (uVar2 == '\x02') {
            if (0 < iVar8) {
              pcVar21 = "Invalid offset. Offset must be negative";
              goto LAB_001057fb;
            }
            iVar22 = 2;
LAB_00105943:
            _Var17 = lseek(priv->handles[uVar10].fd,(long)iVar8,iVar22);
            if (_Var17 < 0) {
              pcVar21 = "Failed to seek file";
LAB_00105963:
              isobusfs_log(2,pcVar21);
              uVar20 = 0x2c;
            }
            else {
              priv->handles[uVar10].offset = _Var17;
              uVar20 = 0;
            }
          }
          else {
            if (uVar2 == '\x01') {
              iVar22 = 1;
              if ((-1 < iVar8) || ((long)(ulong)(uint)-iVar8 <= priv->handles[uVar10].offset))
              goto LAB_00105943;
              pcVar21 = "Invalid offset. Negative offset is too big.";
            }
            else {
              if (uVar2 != '\0') {
                pcVar21 = "invalid position mode";
                goto LAB_00105963;
              }
              iVar22 = 0;
              if (-1 < iVar8) goto LAB_00105943;
              pcVar21 = "Invalid offset. Offset must be positive.";
            }
LAB_001057fb:
            isobusfs_log(2,pcVar21);
            uVar20 = 0x2a;
          }
          iVar9 = (int32_t)priv->handles[uVar10].offset;
        }
        else {
          pDVar14 = fdopendir(priv->handles[uVar10].fd);
          if (pDVar14 == (DIR *)0x0) {
            uVar20 = 0x2c;
          }
          else {
            rewinddir(pDVar14);
            iVar22 = iVar8;
            if (0 < iVar8) {
              do {
                pdVar12 = readdir(pDVar14);
                if (pdVar12 == (dirent *)0x0) {
                  uVar20 = 0x2d;
                  goto LAB_001057bf;
                }
                iVar22 = iVar22 + -1;
              } while (iVar22 != 0);
            }
            priv->handles[uVar10].dir_pos = iVar8;
            uVar20 = 0;
          }
LAB_001057bf:
          iVar9 = priv->handles[uVar10].dir_pos;
        }
        local_1038[0].st_dev._4_3_ = (undefined3)iVar9;
        local_1038[0].st_dev._7_1_ = (undefined1)((uint)iVar9 >> 0x18);
      }
    }
    local_1038[0].st_dev._0_1_ = 0x21;
    local_1038[0].st_dev._1_1_ = msg->buf[1];
    local_1038[0].st_dev._2_1_ = uVar20;
    iVar8 = isobusfs_srv_sendto(priv,msg,local_1038,8);
    if (-1 < iVar8) {
      isobusfs_log(4,"> tx: Seek File Response. Error code: %d, offset: %d",uVar20,0);
      return 0;
    }
    pcVar21 = "can\'t send seek file response";
    goto LAB_001059ce;
  case 2:
    local_10e0 = 0xffffffffffffff;
    uVar3 = *(ushort *)(msg->buf + 4);
    uVar25 = (uint)uVar3;
    isobusfs_log(4,"< rx: Read File Request. tan: %d, handle: %d, count: %d",msg->buf[1],msg->buf[2]
                 ,uVar25);
    uVar7 = 0xfffa;
    if (uVar25 < 0xfffa) {
      uVar7 = uVar25;
    }
    uVar10 = (ulong)uVar7;
    buf = (undefined8 *)malloc(uVar10 + 6);
    if (buf == (undefined8 *)0x0) {
      local_10f0 = 0;
      isobusfs_log(2,"failed to allocate memory");
      buf = &local_10e0;
      uVar20 = 0x2b;
    }
    else {
      piVar15 = isobusfs_srv_get_client_by_msg(priv,msg);
      if (piVar15 == (isobusfs_srv_client *)0x0) {
        local_10f0 = 0;
        isobusfs_log(2,"client not found");
        uVar20 = 0x2c;
      }
      else {
        uVar16 = 0;
        piVar11 = priv->handles + msg->buf[2];
        if ((ulong)msg->buf[2] == 0xff) {
          isobusfs_log(2,"failed to find file with handle: %x");
          uVar16 = CONCAT71((int7)((ulong)uVar16 >> 8),4);
          piVar11 = (isobusfs_srv_handles *)0x0;
        }
        pDVar14 = (DIR *)piVar11->dir;
        puVar23 = (undefined1 *)((long)buf + 6);
        local_10d0 = uVar16;
        if (pDVar14 == (DIR *)0x0) {
          local_10f0 = read(piVar11->fd,puVar23,uVar10);
        }
        else {
          local_10d8 = puVar23;
          if (0 < piVar11->dir_pos) {
            iVar8 = 0;
            do {
              pdVar12 = readdir(pDVar14);
              if (pdVar12 == (dirent *)0x0) break;
              iVar8 = iVar8 + 1;
            } while (iVar8 < piVar11->dir_pos);
          }
          local_10f0 = 0;
          do {
            pdVar12 = readdir(pDVar14);
            if (pdVar12 == (dirent *)0x0) break;
            pcVar21 = pdVar12->d_name;
            iVar8 = check_access_with_base(piVar11->path,pcVar21,4);
            if (iVar8 == 0) {
              bVar4 = false;
              iVar8 = fstatat(piVar11->fd,pcVar21,local_1038,0);
              if (-1 < iVar8) {
                __n = strlen(pcVar21);
                puVar23 = local_10d8;
                if (__n < 0x100) {
                  bVar4 = true;
                  if (__n + local_10f0 + 10 <= uVar10) {
                    local_10d8[local_10f0] = (char)__n;
                    memcpy(local_10d8 + local_10f0 + 1,pcVar21,__n);
                    lVar19 = local_10f0 + __n;
                    uVar7 = local_1038[0].st_mode & 0xf000;
                    iVar8 = check_access_with_base(piVar11->path,pcVar21,2);
                    puVar23[lVar19 + 1] = iVar8 != 0 | (uVar7 == 0x4000) << 4;
                    local_10c8.st_dev = local_1038[0].st_mtim.tv_sec;
                    ptVar13 = localtime((time_t *)&local_10c8);
                    if ((ptVar13 == (tm *)0x0) || (ptVar13->tm_year - 0xd0U < 0xffffff80)) {
                      uVar5 = 0;
                    }
                    else {
                      uVar5 = (short)ptVar13->tm_year * 0x200 + 0x6000U | (ushort)ptVar13->tm_mday |
                              (short)ptVar13->tm_mon * 0x20 + 0x20U;
                    }
                    *(ushort *)(puVar23 + lVar19 + 2) = uVar5;
                    local_10c8.st_dev = local_1038[0].st_mtim.tv_sec;
                    ptVar13 = localtime((time_t *)&local_10c8);
                    if (ptVar13 == (tm *)0x0) {
                      uVar5 = 0;
                    }
                    else {
                      uVar5 = (ushort)(ptVar13->tm_min << 5) | (ushort)(ptVar13->tm_hour << 0xb) |
                              (ushort)((uint)(ptVar13->tm_sec - (ptVar13->tm_sec >> 0x1f)) >> 1);
                    }
                    *(ushort *)(puVar23 + lVar19 + 4) = uVar5;
                    *(undefined4 *)(puVar23 + lVar19 + 6) = (undefined4)local_1038[0].st_size;
                    local_10f0 = lVar19 + 10;
                    goto LAB_001051fb;
                  }
                }
                else {
                  bVar4 = false;
                }
              }
            }
            else {
LAB_001051fb:
              bVar4 = false;
            }
          } while (!bVar4);
        }
        uVar20 = 0x2d;
        if (local_10f0 != 0) {
          uVar20 = (undefined1)local_10d0;
        }
        if (uVar3 == 0) {
          uVar20 = (undefined1)local_10d0;
        }
      }
    }
    *(undefined1 *)buf = 0x22;
    *(uint8_t *)((long)buf + 1) = msg->buf[1];
    *(undefined1 *)((long)buf + 2) = uVar20;
    *(short *)((long)buf + 4) = (short)local_10f0;
    buf_size = 8;
    if (8 < (long)(local_10f0 + 6U)) {
      buf_size = local_10f0 + 6U;
    }
    iVar8 = isobusfs_srv_sendto(priv,msg,buf,buf_size);
    if (iVar8 < 0) {
      isobusfs_log(2,"can\'t send Read File Response");
    }
    else {
      uVar16 = isobusfs_error_to_str(uVar20);
      isobusfs_log(4,"> tx: Read File Response. Error code: %d (%s), readed size: %d",uVar20,uVar16,
                   local_10f0);
    }
    free(buf);
    return iVar8;
  default:
    isobusfs_log(2,"%s: unsupported function: %i","isobusfs_srv_rx_cg_fa");
    isobusfs_srv_send_error(priv,msg,ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);
    return 0;
  case 4:
    piVar15 = isobusfs_srv_get_client_by_msg(priv,msg);
    if (piVar15 == (isobusfs_srv_client *)0x0) {
      isobusfs_log(2,"client not found");
      uVar20 = 0x2c;
    }
    else {
      uVar10 = (ulong)msg->buf[2];
      piVar11 = priv->handles + uVar10;
      if (uVar10 == 0xff) {
        isobusfs_log(2,"%s: invalid handle %d","isobusfs_srv_release_handle",0xff);
      }
      else {
        lVar19 = 5;
        do {
          if (piVar11->clients[lVar19 + -5] == piVar15) {
            piVar11->clients[lVar19 + -5] = (isobusfs_srv_client *)0x0;
            piVar18 = &priv->handles[uVar10].refcount;
            *piVar18 = *piVar18 + -1;
            uVar20 = 0;
            isobusfs_log(4,"%s: client %p removed from handle %d","isobusfs_srv_release_handle",
                         piVar15,uVar10);
            if (priv->handles[uVar10].refcount == 0) {
              isobusfs_log(4,"%s: closing handle %d","isobusfs_srv_release_handle",uVar10);
              pDVar14 = (DIR *)priv->handles[uVar10].dir;
              if (pDVar14 == (DIR *)0x0) {
                close(priv->handles[uVar10].fd);
              }
              else {
                closedir(pDVar14);
              }
              uVar20 = 0;
              memset(piVar11,0,0x790);
              priv->handles_count = priv->handles_count + -1;
            }
            goto LAB_0010583d;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0xf2);
        isobusfs_log(1,"%s: client %p not found in handle %d","isobusfs_srv_release_handle",piVar15,
                     uVar10);
      }
      isobusfs_log(2,"failed to release handle: %x",msg->buf[2]);
      uVar20 = 4;
    }
LAB_0010583d:
    local_1038[0].st_dev._0_1_ = 0x24;
    local_1038[0].st_dev._1_1_ = msg->buf[1];
    local_1038[0].st_dev._3_4_ = 0xffffffff;
    local_1038[0].st_dev._7_1_ = 0xff;
    local_1038[0].st_ino._0_1_ = 0xff;
    local_1038[0].st_dev._2_1_ = uVar20;
    iVar8 = isobusfs_srv_sendto(priv,msg,local_1038,9);
    if (-1 < iVar8) {
      isobusfs_log(4,"> tx: Close File Response. Error code: %d",uVar20);
      return iVar8;
    }
  }
  pcVar21 = "can\'t send current directory response";
LAB_001059ce:
  isobusfs_log(2,pcVar21);
  return iVar8;
}

Assistant:

int isobusfs_srv_rx_cg_fa(struct isobusfs_srv_priv *priv,
			  struct isobusfs_msg *msg)
{
	int func = isobusfs_buf_to_function(msg->buf);
	int ret = 0;

	switch (func) {
	case ISOBUSFS_FA_F_OPEN_FILE_REQ:
		ret = isobusfs_srv_fa_open_file_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_CLOSE_FILE_REQ:
		ret = isobusfs_srv_fa_cf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_READ_FILE_REQ:
		ret = isobusfs_srv_fa_rf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_SEEK_FILE_REQ:
		ret = isobusfs_srv_fa_sf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_WRITE_FILE_REQ: /* fall through */
	default:
		pr_warn("%s: unsupported function: %i", __func__, func);
		isobusfs_srv_send_error(priv, msg,
					ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);
	}

	return ret;
}